

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

Col_Word Col_NewFloatWord(double value)

{
  double dVar1;
  FloatConvert c;
  Col_Word word;
  double value_local;
  
  dVar1 = (double)((ulong)value & 0xfffffffffffffffc);
  value_local = (double)((ulong)dVar1 | 2);
  if (!NAN(value)) {
    if ((dVar1 != value) || (NAN(dVar1) || NAN(value))) {
      value_local = (double)AllocCells(1);
      (*(Cell *)value_local)[0] = '\x02';
      (*(Cell *)value_local)[1] = '\0';
      *(char *)((long)value_local + 2) = '\b';
      *(char *)((long)value_local + 3) = '\0';
      *(char *)((long)value_local + 8) = '\0';
      *(char *)((long)value_local + 9) = '\0';
      *(char *)((long)value_local + 10) = '\0';
      *(char *)((long)value_local + 0xb) = '\0';
      *(char *)((long)value_local + 0xc) = '\0';
      *(char *)((long)value_local + 0xd) = '\0';
      *(char *)((long)value_local + 0xe) = '\0';
      *(char *)((long)value_local + 0xf) = '\0';
      *(double *)(*(Cell *)value_local + 0x10) = value;
    }
  }
  return (Col_Word)value_local;
}

Assistant:

Col_Word
Col_NewFloatWord(
    double value)   /*!< Floating point value of the word to create. */
{
    Col_Word word;  /* Resulting word in the general case. */
    FloatConvert c;

    /*
     * Return immediate value if possible. The comparison of value against
     * itself detects NaN, which can also be represented as immediate value.
     */

    word = WORD_SMALLFP_NEW(value, c);
    if (value != value || WORD_SMALLFP_VALUE(word, c) == value) {
        return word;
    }

    /*
     * Create a new floating point word.
     */

    word = (Col_Word) AllocCells(1);
    WORD_FPWRAP_INIT(word, 0, value);

    return word;
}